

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionTextureState
          (DeviceContextVkImpl *this,TextureVkImpl *TextureVk,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,STATE_TRANSITION_FLAGS Flags,VkImageSubresourceRange *pSubresRange
          )

{
  undefined *puVar1;
  bool bVar2;
  STATE_TRANSITION_FLAGS SVar3;
  VkImageLayout NewLayout_00;
  VkPipelineStageFlags SrcStages;
  RESOURCE_STATE RVar4;
  VkImageLayout VVar5;
  RenderPassVkImpl *pRVar6;
  Char *pCVar7;
  TextureDesc *pTVar8;
  undefined8 uVar9;
  TextureFormatAttribs *pTVar10;
  RenderDeviceVkImpl *this_00;
  VulkanLogicalDevice *this_01;
  ExtensionFeatures *pEVar11;
  char (*Args_1) [35];
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  undefined7 in_register_00000081;
  char (*Args_2) [64];
  bool FragDensityMapInsteadOfShadingRate;
  char (*in_stack_fffffffffffffe68) [26];
  VkImageLayout local_18c;
  undefined1 local_158 [8];
  string msg_1;
  VkPipelineStageFlags NewStages;
  VkPipelineStageFlags OldStages;
  VkImageLayout NewLayout;
  VkImageLayout OldLayout;
  bool FragDensityMap;
  ExtensionFeatures *ExtFeatures;
  bool AfterWrite;
  TextureFormatAttribs *FmtAttribs;
  TextureDesc *TexDesc;
  undefined4 local_f8;
  VkImageSubresourceRange FullSubresRange;
  VkImage vkImg;
  String local_c0;
  undefined1 local_a0 [8];
  string _msg_1;
  string _msg;
  undefined1 local_50 [8];
  string msg;
  VkImageSubresourceRange *pSubresRange_local;
  RESOURCE_STATE RStack_1c;
  STATE_TRANSITION_FLAGS Flags_local;
  RESOURCE_STATE NewState_local;
  RESOURCE_STATE OldState_local;
  TextureVkImpl *TextureVk_local;
  DeviceContextVkImpl *this_local;
  
  Args_2 = (char (*) [64])CONCAT71(in_register_00000081,Flags);
  msg.field_2._8_8_ = pSubresRange;
  pRVar6 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar6 != (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              ((string *)local_50,
               (char (*) [55])"State transitions are not allowed inside a render pass");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"TransitionTextureState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xbc9);
    std::__cxx11::string::~string((string *)local_50);
  }
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    bVar2 = TextureBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>);
    if (!bVar2) {
      pTVar8 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)TextureVk);
      FormatString<char[44],char_const*,char[64]>
                ((string *)((long)&_msg_1.field_2 + 8),
                 (Diligent *)"Failed to transition the state of texture \'",(char (*) [44])pTVar8,
                 (char **)"\' because the state is unknown and is not explicitly specified.",Args_2)
      ;
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar9 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar9,0);
      }
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      return;
    }
    RStack_1c = TextureBase<Diligent::EngineVkImplTraits>::GetState
                          (&TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>);
  }
  else {
    bVar2 = TextureBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>);
    RStack_1c = OldState;
    if ((bVar2) &&
       (RVar4 = TextureBase<Diligent::EngineVkImplTraits>::GetState
                          (&TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>),
       RVar4 != OldState)) {
      RVar4 = TextureBase<Diligent::EngineVkImplTraits>::GetState
                        (&TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>);
      GetResourceStateString_abi_cxx11_(&local_c0,(Diligent *)(ulong)RVar4,State);
      pTVar8 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)TextureVk);
      GetResourceStateString_abi_cxx11_((String *)&vkImg,(Diligent *)(ulong)OldState,State_00);
      FormatString<char[11],std::__cxx11::string,char[14],char_const*,char[32],std::__cxx11::string,char[26]>
                ((string *)local_a0,(Diligent *)"The state ",(char (*) [11])&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc2ad6e,
                 (char (*) [14])pTVar8,(char **)"\' does not match the old state ",
                 (char (*) [32])&vkImg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " specified by the barrier",in_stack_fffffffffffffe68);
      std::__cxx11::string::~string((string *)&vkImg);
      std::__cxx11::string::~string((string *)&local_c0);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar9 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar9,0);
      }
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  EnsureVkCmdBuffer(this);
  FullSubresRange._12_8_ = TextureVkImpl::GetVkImage(TextureVk);
  if (msg.field_2._8_8_ == 0) {
    msg.field_2._8_8_ = (long)&TexDesc + 4;
    TexDesc._4_4_ = 0;
    FullSubresRange.baseMipLevel = 0;
    FullSubresRange.levelCount = 0xffffffff;
    local_f8 = 0;
    FullSubresRange.aspectMask = 0xffffffff;
  }
  if (*(int *)msg.field_2._8_8_ == 0) {
    pTVar8 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)TextureVk);
    pTVar10 = GetTextureFormatAttribs(pTVar8->Format);
    if (pTVar10->ComponentType == COMPONENT_TYPE_DEPTH) {
      *(undefined4 *)msg.field_2._8_8_ = 2;
    }
    else if (pTVar10->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
      *(undefined4 *)msg.field_2._8_8_ = 6;
    }
    else {
      *(undefined4 *)msg.field_2._8_8_ = 1;
    }
  }
  bVar2 = anon_unknown_511::ResourceStateHasWriteAccess(RStack_1c);
  this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  this_01 = RenderDeviceVkImpl::GetLogicalDevice(this_00);
  pEVar11 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(this_01);
  FragDensityMapInsteadOfShadingRate = (pEVar11->FragmentDensityMap).fragmentDensityMap != 0;
  SVar3 = Diligent::operator&(Flags,STATE_TRANSITION_FLAG_DISCARD_CONTENT);
  if (SVar3 == STATE_TRANSITION_FLAG_NONE) {
    local_18c = ResourceStateToVkImageLayout(RStack_1c,false,FragDensityMapInsteadOfShadingRate);
  }
  else {
    local_18c = VK_IMAGE_LAYOUT_UNDEFINED;
  }
  NewLayout_00 = ResourceStateToVkImageLayout(NewState,false,FragDensityMapInsteadOfShadingRate);
  SrcStages = ResourceStateFlagsToVkPipelineStageFlags(RStack_1c);
  msg_1.field_2._12_4_ = ResourceStateFlagsToVkPipelineStageFlags(NewState);
  RVar4 = Diligent::operator&(RStack_1c,NewState);
  if (((RVar4 != NewState) || (local_18c != NewLayout_00)) || (bVar2)) {
    Args_1 = (char (*) [35])(ulong)NewLayout_00;
    VulkanUtilities::VulkanCommandBuffer::TransitionImageLayout
              (&this->m_CommandBuffer,(VkImage)FullSubresRange._12_8_,local_18c,NewLayout_00,
               (VkImageSubresourceRange *)msg.field_2._8_8_,SrcStages,msg_1.field_2._12_4_);
    SVar3 = Diligent::operator&(Flags,STATE_TRANSITION_FLAG_UPDATE_STATE);
    if (SVar3 != STATE_TRANSITION_FLAG_NONE) {
      TextureBase<Diligent::EngineVkImplTraits>::SetState
                (&TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>,NewState);
      VVar5 = TextureVkImpl::GetLayout(TextureVk);
      if (VVar5 != NewLayout_00) {
        FormatString<char[26],char[35]>
                  ((string *)local_158,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"TextureVk.GetLayout() == NewLayout",Args_1);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"TransitionTextureState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xc11);
        std::__cxx11::string::~string((string *)local_158);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionTextureState(TextureVkImpl&           TextureVk,
                                                 RESOURCE_STATE           OldState,
                                                 RESOURCE_STATE           NewState,
                                                 STATE_TRANSITION_FLAGS   Flags,
                                                 VkImageSubresourceRange* pSubresRange /* = nullptr*/)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (TextureVk.IsInKnownState())
        {
            OldState = TextureVk.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of texture '", TextureVk.GetDesc().Name, "' because the state is unknown and is not explicitly specified.");
            return;
        }
    }
    else
    {
        if (TextureVk.IsInKnownState() && TextureVk.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(TextureVk.GetState()), " of texture '",
                              TextureVk.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    EnsureVkCmdBuffer();

    VkImage vkImg = TextureVk.GetVkImage();

    VkImageSubresourceRange FullSubresRange;
    if (pSubresRange == nullptr)
    {
        pSubresRange = &FullSubresRange;

        FullSubresRange.aspectMask     = 0;
        FullSubresRange.baseArrayLayer = 0;
        FullSubresRange.layerCount     = VK_REMAINING_ARRAY_LAYERS;
        FullSubresRange.baseMipLevel   = 0;
        FullSubresRange.levelCount     = VK_REMAINING_MIP_LEVELS;
    }

    if (pSubresRange->aspectMask == 0)
    {
        const TextureDesc&          TexDesc    = TextureVk.GetDesc();
        const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
        else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            // If image has a depth / stencil format with both depth and stencil components, then the
            // aspectMask member of subresourceRange must include both VK_IMAGE_ASPECT_DEPTH_BIT and
            // VK_IMAGE_ASPECT_STENCIL_BIT
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
        }
        else
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    const auto&                ExtFeatures    = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
    const bool                 FragDensityMap = ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE;
    const VkImageLayout        OldLayout      = (Flags & STATE_TRANSITION_FLAG_DISCARD_CONTENT) != 0 ? VK_IMAGE_LAYOUT_UNDEFINED : ResourceStateToVkImageLayout(OldState, /*IsInsideRenderPass = */ false, FragDensityMap);
    const VkImageLayout        NewLayout      = ResourceStateToVkImageLayout(NewState, /*IsInsideRenderPass = */ false, FragDensityMap);
    const VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
    const VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);

    if (((OldState & NewState) != NewState) || OldLayout != NewLayout || AfterWrite)
    {
        m_CommandBuffer.TransitionImageLayout(vkImg, OldLayout, NewLayout, *pSubresRange, OldStages, NewStages);
        if ((Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0)
        {
            TextureVk.SetState(NewState);
            VERIFY_EXPR(TextureVk.GetLayout() == NewLayout);
        }
    }
}